

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O3

void WebPMuxDelete(WebPMux *mux)

{
  WebPMuxImage *wpi;
  
  if (mux != (WebPMux *)0x0) {
    wpi = mux->images_;
    while (wpi != (WebPMuxImage *)0x0) {
      wpi = MuxImageDelete(wpi);
      mux->images_ = wpi;
    }
    ChunkListDelete(&mux->vp8x_);
    ChunkListDelete(&mux->iccp_);
    ChunkListDelete(&mux->anim_);
    ChunkListDelete(&mux->exif_);
    ChunkListDelete(&mux->xmp_);
    ChunkListDelete(&mux->unknown_);
    WebPSafeFree(mux);
    return;
  }
  return;
}

Assistant:

void WebPMuxDelete(WebPMux* mux) {
  if (mux != NULL) {
    MuxRelease(mux);
    WebPSafeFree(mux);
  }
}